

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O0

int * StringBuilder<int,char_const(&)[5],int_const&,char_const(&)[4]>
                (int *arg,char (*args) [5],int *args_1,char (*args_2) [4])

{
  int *in_RCX;
  char (*in_RDX) [5];
  int *in_RDI;
  char (*in_R8) [4];
  string local_68 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  
  StringBuilder<int>(in_RDI);
  StringBuilder<char[5],int_const&,char_const(&)[4]>(in_RDX,in_RCX,in_R8);
  std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  return in_RDI;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}